

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootup.c
# Opt level: O2

void __thiscall CMud::LoadTime(CMud *this)

{
  long lVar1;
  short sVar2;
  long lVar3;
  
  lVar3 = current_time + -0x39f53371;
  sVar2 = (short)(lVar3 % 0x5a0);
  time_info.hour = (int)(sVar2 / 0x3c);
  time_info.day =
       (int)((long)((ulong)(uint)((int)(lVar3 % 0xa8c0) >> 0x1f) << 0x20 |
                   lVar3 % 0xa8c0 & 0xffffffffU) / 0x5a0);
  lVar1 = (long)((ulong)(uint)((int)(lVar3 % 0x7e900) >> 0x1f) << 0x20 |
                lVar3 % 0x7e900 & 0xffffffffU) / 0xa8c0;
  time_info.month = (int)lVar1;
  time_info.year = (int)(lVar3 / 0x7e900) + 0x5eb;
  time_info.season = (int)(char)(((char)((char)lVar1 + '\x01') % '\f') / '\x03');
  if (lVar3 % 0x5a0 < 300) {
    sun = 0;
  }
  else {
    sun = 1;
    if ((0x3b < (ushort)(sVar2 - 300U)) && (sun = 2, 0x12 < (ushort)(sVar2 / 0x3c))) {
      sun = (ushort)((ushort)(sVar2 - 0x474U) < 0x3c) * 3;
    }
  }
  berus_pos = (short)(lVar3 % 0x7e90) / 0x5a;
  calabren_pos = (short)((long)((ulong)(uint)((int)(lVar3 % 54000) >> 0x1f) << 0x20 |
                               lVar3 % 54000 & 0xffffffffU) / 0x96);
  return;
}

Assistant:

void CMud::LoadTime()
{
	long lhour;

	lhour = (current_time - 650336715) / (PULSE_TICK / PULSE_PER_SECOND);
	time_info.hour = ((current_time - RS_EPOCH) % (60 * 24)) / (60);
	time_info.day = ((current_time - RS_EPOCH) % (60 * 60 * 12)) / (60 * 24);
	time_info.month = ((current_time - RS_EPOCH) % (60 * 60 * 24 * 6)) / (60 * 60 * 12);
	time_info.year  = 1515 + (current_time - RS_EPOCH) / (60 * 60 * 24 * 6);
	time_info.season= ((time_info.month + 1) % 12) / 3;

	if ( time_info.hour <  5 )
		sun = SolarPosition::Dark;
	else if ( time_info.hour <  6 )
		sun = SolarPosition::Sunrise;
	else if ( time_info.hour < 19 )
		sun = SolarPosition::Daylight;
	else if ( time_info.hour < 20 )
		sun = SolarPosition::Sunset;
	else
		sun = SolarPosition::Dark;

	berus_pos = ((current_time-RS_EPOCH)%(LunarSpeed::Berus*360))/LunarSpeed::Berus;
	calabren_pos = ((current_time-RS_EPOCH)%(LunarSpeed::Calabren*360))/LunarSpeed::Calabren;
}